

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddBtreeIndex
              (WhereLoopBuilder *pBuilder,SrcList_item *pSrc,Index *pProbe,LogEst nInMul)

{
  byte *pbVar1;
  ushort uVar2;
  u16 uVar3;
  u16 uVar4;
  ushort uVar5;
  ushort uVar6;
  LogEst LVar7;
  LogEst N;
  uint uVar8;
  uint uVar9;
  Parse *pParse;
  sqlite3 *db;
  WhereLoop *p;
  ulong uVar10;
  Expr *pEVar11;
  u32 opMask;
  short nInMul_00;
  LogEst a;
  LogEst LVar12;
  short a_00;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  WhereTerm *pTerm;
  ushort uVar17;
  ushort uVar18;
  short sVar19;
  ushort uVar20;
  ulong uVar21;
  u64 x;
  uint uVar22;
  WhereTerm *local_e8;
  WhereTerm *local_e0;
  WhereScan scan;
  
  pParse = pBuilder->pWInfo->pParse;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return 7;
  }
  p = pBuilder->pNew;
  uVar8 = p->wsFlags;
  uVar15 = 0x18;
  if ((uVar8 & 0x20) == 0) {
    uVar15 = 0x1bf;
  }
  opMask = uVar15 & 0xffffff83;
  if ((pProbe->field_0x63 & 4) == 0) {
    opMask = uVar15;
  }
  uVar2 = (p->u).btree.nEq;
  uVar3 = (p->u).btree.nBtm;
  uVar4 = (p->u).btree.nTop;
  uVar5 = p->nSkip;
  uVar6 = p->nLTerm;
  uVar10 = p->prereq;
  LVar7 = p->nOut;
  pTerm = whereScanInit(&scan,pBuilder->pWC,pSrc->iCursor,(uint)uVar2,opMask,pProbe);
  p->rSetup = 0;
  N = *pProbe->aiRowLogEst;
  a = estLog(N);
  local_e0 = (WhereTerm *)0x0;
  local_e8 = (WhereTerm *)0x0;
  iVar16 = 0;
  do {
    if ((iVar16 != 0) || (pTerm == (WhereTerm *)0x0)) goto LAB_001678b2;
    uVar18 = pTerm->eOperator;
    uVar15 = (uint)uVar2;
    if (uVar18 == 0x100) {
      iVar13 = indexColumnNotNull(pProbe,uVar15);
      iVar14 = 0;
      if (iVar13 == 0) goto LAB_001673ed;
    }
    else {
LAB_001673ed:
      iVar14 = 0;
      if ((((pTerm->prereqRight & p->maskSelf) == 0) &&
          ((uVar18 != 0x10 || ((pTerm->wtFlags & 0x100) == 0)))) &&
         ((((pSrc->fg).jointype & 8) == 0 ||
          (((uVar18 & 0x180) == 0 || (iVar14 = 0, (pTerm->pExpr->flags & 1) != 0)))))) {
        if ((pProbe->onError == '\0') || (uVar22 = 2, pProbe->nKeyCol - 1 != uVar15)) {
          uVar22 = 1;
        }
        pBuilder->bldFlags = pBuilder->bldFlags | uVar22;
        p->wsFlags = uVar8;
        (p->u).btree.nEq = uVar2;
        (p->u).btree.nBtm = uVar3;
        (p->u).btree.nTop = uVar4;
        p->nLTerm = uVar6;
        iVar14 = whereLoopResize(db,p,uVar6 + 1);
        if (iVar14 != 0) {
LAB_001678b2:
          p->prereq = uVar10;
          (p->u).btree.nEq = uVar2;
          (p->u).btree.nBtm = uVar3;
          (p->u).btree.nTop = uVar4;
          p->nSkip = uVar5;
          p->wsFlags = uVar8;
          p->nOut = LVar7;
          p->nLTerm = uVar6;
          if (uVar2 != uVar5) {
            return iVar16;
          }
          if ((uint)pProbe->nKeyCol <= uVar2 + 1) {
            return iVar16;
          }
          if ((pProbe->field_0x63 & 0x40) != 0) {
            return iVar16;
          }
          if (pProbe->aiRowLogEst[(ulong)uVar2 + 1] < 0x2a) {
            return iVar16;
          }
          iVar16 = whereLoopResize(db,p,uVar6 + 1);
          if (iVar16 != 0) {
            return iVar16;
          }
          (p->u).btree.nEq = (p->u).btree.nEq + 1;
          uVar15._0_2_ = p->nLTerm;
          uVar15._2_2_ = p->nSkip;
          p->nLTerm = (undefined2)uVar15 + 1;
          p->nSkip = uVar15._2_2_ + 1;
          p->aLTerm[uVar15 & 0xffff] = (WhereTerm *)0x0;
          pbVar1 = (byte *)((long)&p->wsFlags + 1);
          *pbVar1 = *pbVar1 | 0x80;
          sVar19 = pProbe->aiRowLogEst[uVar2] - pProbe->aiRowLogEst[(ulong)uVar2 + 1];
          p->nOut = p->nOut - sVar19;
          whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul + sVar19 + 5);
          p->nOut = LVar7;
          (p->u).btree.nEq = uVar2;
          p->nSkip = uVar2;
          p->wsFlags = uVar8;
          return 0;
        }
        uVar20 = p->nLTerm;
        uVar17 = uVar20 + 1;
        p->nLTerm = uVar17;
        p->aLTerm[uVar20] = pTerm;
        p->prereq = ~p->maskSelf & (pTerm->prereqRight | uVar10);
        if ((uVar18 & 1) != 0) {
          pEVar11 = pTerm->pExpr;
          uVar22 = p->wsFlags | 4;
          p->wsFlags = uVar22;
          if ((pEVar11->flags & 0x800) == 0) {
            if (((pEVar11->x).pList == (ExprList *)0x0) ||
               (x = (u64)((pEVar11->x).pList)->nExpr, x == 0)) goto LAB_0016763c;
            LVar12 = sqlite3LogEst(x);
          }
          else {
            uVar20 = 1;
            if (1 < uVar17) {
              uVar20 = uVar17;
            }
            LVar12 = 0x2e;
            for (uVar21 = 0; uVar20 - 1 != uVar21; uVar21 = uVar21 + 1) {
              if ((p->aLTerm[uVar21] != (WhereTerm *)0x0) && (p->aLTerm[uVar21]->pExpr == pEVar11))
              {
                LVar12 = 0;
              }
            }
          }
          goto LAB_0016763f;
        }
        if ((uVar18 & 0x82) != 0) {
          sVar19 = pProbe->aiColumn[uVar2];
          uVar9 = p->wsFlags;
          uVar22 = uVar9 | 1;
          p->wsFlags = uVar22;
          if (sVar19 == -1) {
LAB_0016761f:
            uVar22 = uVar9 | 0x1001;
          }
          else {
            LVar12 = 0;
            if ((nInMul != 0) || (sVar19 < 1)) goto LAB_0016763f;
            if (pProbe->nKeyCol - 1 != uVar15) goto LAB_0016763c;
            if ((pProbe->field_0x63 & 8) != 0) goto LAB_0016761f;
            uVar22 = uVar9 | 0x10001;
          }
          p->wsFlags = uVar22;
          LVar12 = 0;
          goto LAB_0016763f;
        }
        if ((uVar18 >> 8 & 1) == 0) {
          if ((uVar18 & 0x24) == 0) {
            p->wsFlags = p->wsFlags | 0x12;
            iVar16 = whereRangeVectorLen(pParse,pSrc->iCursor,pProbe,(uint)uVar2,pTerm);
            (p->u).btree.nTop = (u16)iVar16;
            uVar22 = p->wsFlags;
            local_e8 = pTerm;
            if ((uVar22 & 0x20) == 0) {
              local_e0 = (WhereTerm *)0x0;
              goto LAB_0016763c;
            }
            local_e0 = p->aLTerm[(ulong)p->nLTerm - 2];
            LVar12 = 0;
          }
          else {
            p->wsFlags = p->wsFlags | 0x22;
            iVar14 = whereRangeVectorLen(pParse,pSrc->iCursor,pProbe,uVar15,pTerm);
            (p->u).btree.nBtm = (u16)iVar14;
            local_e0 = pTerm;
            if ((pTerm->wtFlags & 0x100) == 0) {
              uVar22 = p->wsFlags;
              local_e8 = (WhereTerm *)0x0;
              goto LAB_0016763c;
            }
            iVar14 = whereLoopResize(db,p,p->nLTerm + 1);
            if (iVar14 != 0) goto LAB_001678b2;
            uVar20 = p->nLTerm;
            p->nLTerm = uVar20 + 1;
            p->aLTerm[uVar20] = pTerm + 1;
            uVar22 = p->wsFlags | 0x10;
            p->wsFlags = uVar22;
            (p->u).btree.nTop = 1;
            LVar12 = 0;
            local_e8 = pTerm + 1;
          }
        }
        else {
          uVar22 = p->wsFlags | 8;
          p->wsFlags = uVar22;
LAB_0016763c:
          LVar12 = 0;
        }
LAB_0016763f:
        if ((uVar22 & 2) == 0) {
          uVar15 = (p->u).vtab.idxNum + 1;
          (p->u).btree.nEq = (u16)uVar15;
          if ((pTerm->truthProb < 1) && (-1 < pProbe->aiColumn[uVar2])) {
            uVar15 = (uint)(ushort)((pTerm->truthProb - LVar12) + p->nOut);
          }
          else {
            uVar21 = (ulong)(uVar15 & 0xffff);
            uVar20 = (pProbe->aiRowLogEst[uVar21] - pProbe->aiRowLogEst[uVar21 - 1]) + p->nOut;
            uVar15 = uVar20 + 10;
            if ((uVar18 >> 8 & 1) == 0) {
              uVar15 = (uint)uVar20;
            }
          }
        }
        else {
          uVar18 = p->nOut;
          uVar20 = uVar18;
          if (local_e0 != (WhereTerm *)0x0) {
            if (local_e0->truthProb < 1) {
              uVar20 = local_e0->truthProb + uVar18;
            }
            else {
              uVar20 = uVar18 - 0x14;
            }
          }
          if (local_e8 != (WhereTerm *)0x0) {
            if (local_e8->truthProb < 1) {
              uVar20 = local_e8->truthProb + uVar20;
            }
            else {
              uVar20 = uVar20 - 0x14;
            }
          }
          uVar17 = uVar20;
          if ((((local_e0 != (WhereTerm *)0x0) && (local_e8 != (WhereTerm *)0x0)) &&
              (0 < local_e0->truthProb)) && (uVar17 = uVar20 - 0x14, local_e8->truthProb < 1)) {
            uVar17 = uVar20;
          }
          uVar15 = (-1 - (uint)(local_e0 != (WhereTerm *)0x0)) +
                   (uint)(local_e8 == (WhereTerm *)0x0) + (int)(short)uVar18;
          uVar18 = 10;
          if (10 < (short)uVar17) {
            uVar18 = uVar17;
          }
          if ((int)(uint)uVar18 <= (int)uVar15) {
            uVar15 = (uint)uVar18;
          }
        }
        sVar19 = (short)uVar15;
        a_00 = sqlite3LogEstAdd(a,(short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow) +
                                  sVar19 + 1);
        if ((uVar22 & 0x140) == 0) {
          a_00 = sqlite3LogEstAdd(a_00,sVar19 + 0x10);
        }
        nInMul_00 = LVar12 + nInMul;
        p->rRun = a_00 + nInMul_00;
        p->nOut = sVar19 + nInMul_00;
        whereLoopOutputAdjust(pBuilder->pWC,p,N);
        iVar14 = whereLoopInsert(pBuilder,p);
        if ((p->wsFlags & 2) != 0) {
          sVar19 = LVar7;
        }
        p->nOut = sVar19;
        if (((p->wsFlags & 0x10) == 0) && ((p->u).btree.nEq < pProbe->nColumn)) {
          whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul_00);
        }
        p->nOut = LVar7;
      }
    }
    iVar16 = iVar14;
    pTerm = whereScanNext(&scan);
  } while( true );
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  struct SrcList_item *pSrc,      /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN addBtreeIdx(%s), nEq=%d\n",
                     pProbe->zName, pNew->u.btree.nEq));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    /* Do not allow IS constraints from the WHERE clause to be used by the
    ** right table of a LEFT JOIN.  Only constraints in the ON clause are
    ** allowed */
    if( (pSrc->fg.jointype & JT_LEFT)!=0
     && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
     && (eOp & (WO_IS|WO_ISNULL))!=0
    ){
      testcase( eOp & WO_IS );
      testcase( eOp & WO_ISNULL );
      continue;
    }

    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags |= SQLITE_BLDF_UNIQUE;
    }else{
      pBuilder->bldFlags |= SQLITE_BLDF_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0 
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0 
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0 
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      pNew->wsFlags |= WHERE_COLUMN_IN;
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
        assert( nIn>0 );  /* RHS always has 2 or more terms...  The parser
                          ** changes "x IN (?)" into "x=?". */
      }
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID 
       || (iCol>0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol>=0 && pProbe->uniqNotNull==0 ){
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }else{
          pNew->wsFlags |= WHERE_ONEROW;
        }
      }
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else if( eOp & (WO_GT|WO_GE) ){
      testcase( eOp & WO_GT );
      testcase( eOp & WO_GE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
      pNew->u.btree.nBtm = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pBtm = pTerm;
      pTop = 0;
      if( pTerm->wtFlags & TERM_LIKEOPT ){
        /* Range contraints that come from the LIKE optimization are
        ** always used in pairs. */
        pTop = &pTerm[1];
        assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
        assert( pTop->wtFlags & TERM_LIKEOPT );
        assert( pTop->eOperator==WO_LT );
        if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
        pNew->aLTerm[pNew->nLTerm++] = pTop;
        pNew->wsFlags |= WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = 1;
      }
    }else{
      assert( eOp & (WO_LT|WO_LE) );
      testcase( eOp & WO_LT );
      testcase( eOp & WO_LE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
      pNew->u.btree.nTop = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pTop = pTerm;
      pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                     pNew->aLTerm[pNew->nLTerm-2] : 0;
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all 
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat3/stat4 data. Or, if there is no stat3/stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0 
         && pProbe->nSample 
         && pNew->u.btree.nEq<=pProbe->nSampleCol
         && ((eOp & WO_IN)==0 || !ExprHasProperty(pTerm->pExpr, EP_xIsSelect))
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a 
            ** "col IS NULL" expression matches twice as many rows 
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18. 
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower. 
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && pProbe->noSkipScan==0
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->zName, saved_nEq, rc));
  return rc;
}